

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O2

bool operator==(ON_wString *lhs,ON_wString *rhs)

{
  bool bVar1;
  int element_count1;
  int iVar2;
  wchar_t *string1;
  wchar_t *string2;
  
  element_count1 = ON_wString::Length(lhs);
  iVar2 = ON_wString::Length(rhs);
  if (element_count1 == iVar2) {
    string1 = ON_wString::operator_cast_to_wchar_t_(lhs);
    string2 = ON_wString::operator_cast_to_wchar_t_(rhs);
    bVar1 = ON_wString::EqualOrdinal(string1,element_count1,string2,element_count1,false);
    return bVar1;
  }
  return false;
}

Assistant:

bool operator==( const ON_wString& lhs, const ON_wString& rhs )
{
  const int length = lhs.Length();
  return   (length == rhs.Length())
    && ON_wString::EqualOrdinal(
    static_cast<const wchar_t*>(lhs),
    length,
    static_cast<const wchar_t*>(rhs),
    length,
    false
    );
}